

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetTargetObjectNames
          (cmGeneratorTarget *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objects)

{
  _Rb_tree_header *p_Var1;
  cmSourceFile *pcVar2;
  _Base_ptr p_Var3;
  pointer ppcVar4;
  _Base_ptr p_Var5;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  pointer ppcVar6;
  _Rb_tree_header *p_Var7;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  cmSourceFile *sf;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mapping;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_88;
  cmGeneratorTarget *local_70;
  cmSourceFile *local_68;
  _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = this;
  GetObjectSources(this,&local_88,config);
  ppcVar4 = local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppcVar6 = local_88.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_68 = *ppcVar6;
      std::
      map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_60,&local_68);
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != ppcVar4);
  }
  (*local_70->LocalGenerator->_vptr_cmLocalGenerator[0xe])(local_70->LocalGenerator,&local_60);
  ppcVar4 = local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppcVar6 = local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppcVar6 == ppcVar4) {
      std::
      _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      if (local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    pcVar2 = *ppcVar6;
    p_Var5 = &p_Var1->_M_header;
    for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
        p_Var3 = (&p_Var3->_M_left)[*(cmSourceFile **)(p_Var3 + 1) < pcVar2]) {
      if (*(cmSourceFile **)(p_Var3 + 1) >= pcVar2) {
        p_Var5 = p_Var3;
      }
    }
    p_Var7 = p_Var1;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (p_Var7 = (_Rb_tree_header *)p_Var5,
       pcVar2 < (cmSourceFile *)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
      p_Var7 = p_Var1;
    }
    if (*(long *)((long)(p_Var7 + 1) + 8) == 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(objects,(value_type *)(p_Var7 + 1));
    ppcVar6 = ppcVar6 + 1;
  }
  __assert_fail("!map_it->second.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0xf70,
                "void cmGeneratorTarget::GetTargetObjectNames(const std::string &, std::vector<std::string> &) const"
               );
}

Assistant:

void cmGeneratorTarget::GetTargetObjectNames(
  std::string const& config, std::vector<std::string>& objects) const
{
  std::vector<cmSourceFile const*> objectSources;
  this->GetObjectSources(objectSources, config);
  std::map<cmSourceFile const*, std::string> mapping;

  for (cmSourceFile const* sf : objectSources) {
    mapping[sf];
  }

  this->LocalGenerator->ComputeObjectFilenames(mapping, this);

  for (cmSourceFile const* src : objectSources) {
    // Find the object file name corresponding to this source file.
    std::map<cmSourceFile const*, std::string>::const_iterator map_it =
      mapping.find(src);
    // It must exist because we populated the mapping just above.
    assert(!map_it->second.empty());
    objects.push_back(map_it->second);
  }
}